

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

TBox<float> *
lumeview::BoxFromCoords<float>
          (TBox<float> *__return_storage_ptr__,float *coords,index_t num,index_t stride)

{
  tvec3<float,_(glm::precision)0> *this;
  float fVar1;
  int i_00;
  ulong uVar2;
  float *pfVar3;
  index_t i;
  uint uVar4;
  uint uVar5;
  index_t j;
  ulong uVar6;
  
  uVar2 = 3;
  if (stride < 3) {
    uVar2 = (ulong)stride;
  }
  TBox<float>::TBox(__return_storage_ptr__,3.4028235e+38,-3.4028235e+38);
  this = &__return_storage_ptr__->maxCorner;
  for (uVar4 = 0; uVar4 < num; uVar4 = uVar4 + stride) {
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      i_00 = (int)uVar6;
      uVar5 = uVar4 + i_00;
      fVar1 = coords[uVar5];
      pfVar3 = glm::tvec3<float,_(glm::precision)0>::operator[]
                         (&__return_storage_ptr__->minCorner,i_00);
      if (fVar1 < *pfVar3) {
        fVar1 = coords[uVar5];
        pfVar3 = glm::tvec3<float,_(glm::precision)0>::operator[]
                           (&__return_storage_ptr__->minCorner,i_00);
        *pfVar3 = fVar1;
      }
      fVar1 = coords[uVar5];
      pfVar3 = glm::tvec3<float,_(glm::precision)0>::operator[](this,i_00);
      if (*pfVar3 <= fVar1 && fVar1 != *pfVar3) {
        fVar1 = coords[uVar5];
        pfVar3 = glm::tvec3<float,_(glm::precision)0>::operator[](this,i_00);
        *pfVar3 = fVar1;
      }
    }
  }
  for (; stride < 3; stride = stride + 1) {
    pfVar3 = glm::tvec3<float,_(glm::precision)0>::operator[]
                       (&__return_storage_ptr__->minCorner,stride);
    *pfVar3 = 0.0;
    pfVar3 = glm::tvec3<float,_(glm::precision)0>::operator[](this,stride);
    *pfVar3 = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

TBox <real_t> BoxFromCoords (const real_t* coords, index_t num, index_t stride)
{
	const index_t cmps = std::min<index_t> (stride, 3);

	TBox <real_t> b (numeric_limits<real_t>::max(), numeric_limits<real_t>::lowest());
	for(index_t i = 0; i < num; i+=stride){
		for(index_t j = 0; j < cmps; ++j){
			if (coords [i+j] < b.minCorner[j])
				b.minCorner[j] = coords [i+j];
			if (coords [i+j] > b.maxCorner[j])
				b.maxCorner[j] = coords [i+j];
		}
	}

	for(index_t i = stride; i < 3; ++i){
		b.minCorner[i] = 0;
		b.maxCorner[i] = 0;
	}

	return b;
}